

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O2

void cards_reverse(Card **cards,uchar cardsCount)

{
  Card *pCVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(byte)(cardsCount - 1);
  for (uVar2 = 0; uVar3 = uVar3 & 0xff, uVar2 < uVar3; uVar2 = uVar2 + 1) {
    pCVar1 = cards[uVar2];
    cards[uVar2] = cards[uVar3];
    cards[uVar3] = pCVar1;
    uVar3 = (ulong)((int)uVar3 - 1);
  }
  return;
}

Assistant:

void cards_reverse(Card ** cards, unsigned char cardsCount)
{
	unsigned char start=0;
	unsigned char end=cardsCount-1;
	Card * card;
	while(start<end)
	{
		card = cards[start];
		cards[start] = cards[end];
		cards[end] = card;
		start++;
		end--;
	}
}